

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O2

string * __thiscall
testing::internal::ConvertIdentifierNameToWords_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *id_name)

{
  bool bVar1;
  bool bVar2;
  internal ch;
  char *p;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ch = (internal)0x0;
  do {
    if (*this == (internal)0x0) {
      return __return_storage_ptr__;
    }
    bVar1 = IsUpper((char)*this);
    bVar2 = true;
    if (!bVar1) {
      bVar1 = IsAlpha((char)ch);
      if (!bVar1) {
        bVar1 = IsLower((char)*this);
        if (bVar1) goto LAB_001220e6;
      }
      if ((byte)ch - 0x30 < 10) {
        bVar2 = false;
      }
      else {
        bVar2 = (byte)*this - 0x30 < 10;
      }
    }
LAB_001220e6:
    bVar1 = IsAlNum((char)*this);
    if (bVar1) {
      if (bVar2) {
        bVar2 = std::operator!=(__return_storage_ptr__,"");
        if (bVar2) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
      }
      ToLower((char)*this);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    ch = *this;
    this = this + 1;
  } while( true );
}

Assistant:

GTEST_API_ std::string ConvertIdentifierNameToWords(const char* id_name) {
  std::string result;
  char prev_char = '\0';
  for (const char* p = id_name; *p != '\0'; prev_char = *(p++)) {
    // We don't care about the current locale as the input is
    // guaranteed to be a valid C++ identifier name.
    const bool starts_new_word = IsUpper(*p) ||
        (!IsAlpha(prev_char) && IsLower(*p)) ||
        (!IsDigit(prev_char) && IsDigit(*p));

    if (IsAlNum(*p)) {
      if (starts_new_word && result != "")
        result += ' ';
      result += ToLower(*p);
    }
  }
  return result;
}